

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraphFlattener::convertMultiLevelInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node)

{
  _Rb_tree_header *p_Var1;
  Node *pNVar2;
  Ref<embree::SceneGraph::Node> *pRVar3;
  Node *in_RAX;
  long *plVar4;
  _Base_ptr p_Var5;
  TransformNode *this_00;
  mapped_type *pmVar6;
  MultiTransformNode *this_01;
  _Base_ptr p_Var7;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  Ref<embree::SceneGraph::Node> local_38;
  
  pNVar2 = node->ptr;
  local_38.ptr = in_RAX;
  if (pNVar2 == (Node *)0x0) {
    p_Var5 = (this->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 == (_Base_ptr)0x0) {
      return;
    }
  }
  else {
    plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::GroupNode::typeinfo,0);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      pRVar3 = (Ref<embree::SceneGraph::Node> *)plVar4[0xe];
      for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar4[0xd]; node_00 != pRVar3;
          node_00 = node_00 + 1) {
        convertMultiLevelInstances(this,group,node_00);
      }
      (**(code **)(*plVar4 + 0x18))(plVar4);
      return;
    }
    plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::TriangleMeshNode::typeinfo,0);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      (**(code **)(*plVar4 + 0x18))(plVar4);
      goto LAB_0015661b;
    }
    plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::QuadMeshNode::typeinfo,0);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      (**(code **)(*plVar4 + 0x18))(plVar4);
      goto LAB_0015661b;
    }
    plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::GridMeshNode::typeinfo,0);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      (**(code **)(*plVar4 + 0x18))(plVar4);
      goto LAB_0015661b;
    }
    plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::SubdivMeshNode::typeinfo,0);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      (**(code **)(*plVar4 + 0x18))(plVar4);
      goto LAB_0015661b;
    }
    plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::HairSetNode::typeinfo,0);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      (**(code **)(*plVar4 + 0x18))(plVar4);
      goto LAB_0015661b;
    }
    plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::PointSetNode::typeinfo,0);
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      (**(code **)(*plVar4 + 0x18))(plVar4);
      goto LAB_0015661b;
    }
    p_Var5 = (this->object_mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 == (_Base_ptr)0x0) goto LAB_0015630f;
  }
  p_Var1 = &(this->object_mapping)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var1->_M_header;
  do {
    if (*(Node **)(p_Var5 + 1) >= pNVar2) {
      p_Var7 = p_Var5;
    }
    p_Var5 = (&p_Var5->_M_left)[*(Node **)(p_Var5 + 1) < pNVar2];
  } while (p_Var5 != (_Base_ptr)0x0);
  if (((_Rb_tree_header *)p_Var7 == p_Var1) || (pNVar2 < *(Node **)(p_Var7 + 1))) {
    if (pNVar2 == (Node *)0x0) {
      return;
    }
LAB_0015630f:
    plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::TransformNode::typeinfo,0);
    if (plVar4 == (long *)0x0) {
      plVar4 = (long *)__dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                      &SceneGraph::MultiTransformNode::typeinfo,0);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 0x10))(plVar4);
        this_01 = (MultiTransformNode *)alignedMalloc(0x88,0x10);
        convertMultiLevelInstances((SceneGraphFlattener *)&stack0xffffffffffffffc8,&this->node);
        SceneGraph::MultiTransformNode::MultiTransformNode
                  (this_01,(vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                            *)(plVar4 + 0xd),&stack0xffffffffffffffc8);
        if (local_38.ptr != (Node *)0x0) {
          (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        pmVar6 = std::
                 map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[](&this->object_mapping,node);
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
        if (pmVar6->ptr != (Node *)0x0) {
          (*(pmVar6->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        pmVar6->ptr = (Node *)this_01;
        local_38.ptr = (Node *)this_01;
        (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    *)group,&stack0xffffffffffffffc8);
        if ((MultiTransformNode *)local_38.ptr != (MultiTransformNode *)0x0) {
          (*(((Node *)&(local_38.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
        }
        (**(code **)(*plVar4 + 0x18))(plVar4);
      }
    }
    else {
      (**(code **)(*plVar4 + 0x10))(plVar4);
      this_00 = (TransformNode *)alignedMalloc(0xa0,0x10);
      convertMultiLevelInstances((SceneGraphFlattener *)&stack0xffffffffffffffc8,&this->node);
      SceneGraph::TransformNode::TransformNode
                (this_00,(Transformations *)(plVar4 + 0xd),&stack0xffffffffffffffc8);
      if (local_38.ptr != (Node *)0x0) {
        (*((local_38.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar6 = std::
               map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[](&this->object_mapping,node);
      (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
      if (pmVar6->ptr != (Node *)0x0) {
        (*(pmVar6->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      pmVar6->ptr = (Node *)this_00;
      local_38.ptr = (Node *)this_00;
      (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
      std::
      vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
      ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                  *)group,&stack0xffffffffffffffc8);
      if ((TransformNode *)local_38.ptr != (TransformNode *)0x0) {
        (*(((Node *)&(local_38.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
      }
      (**(code **)(*plVar4 + 0x18))(plVar4);
    }
    return;
  }
  node = std::
         map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
         ::operator[](&this->object_mapping,node);
LAB_0015661b:
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::push_back(group,node);
  return;
}

Assistant:

void convertMultiLevelInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node)
    {
      if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertMultiLevelInstances(group,child);
      }
      else if (node.dynamicCast<SceneGraph::TriangleMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::QuadMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::GridMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::SubdivMeshNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::HairSetNode>()) {
        group.push_back(node);
      }
      else if (node.dynamicCast<SceneGraph::PointSetNode>()) {
        group.push_back(node);
      }
      else if (object_mapping.find(node) != object_mapping.end()) {
        group.push_back(object_mapping[node]);
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>())
      {
        auto new_node = new SceneGraph::TransformNode(xfmNode->spaces,convertMultiLevelInstances(xfmNode->child));
        object_mapping[node] = new_node;
        group.push_back(new_node);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>())
      {
        auto new_node = new SceneGraph::MultiTransformNode(xfmNode->spaces,convertMultiLevelInstances(xfmNode->child));
        object_mapping[node] = new_node;
        group.push_back(new_node);
      }
    }